

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_begin_zmp(telnet_t *telnet,char *cmd)

{
  char *cmd_local;
  telnet_t *telnet_local;
  
  telnet_begin_sb(telnet,']');
  telnet_zmp_arg(telnet,cmd);
  return;
}

Assistant:

void telnet_begin_zmp(telnet_t *telnet, const char *cmd) {
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);
	telnet_zmp_arg(telnet, cmd);
}